

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O2

void __thiscall soplex::SPxSolverBase<double>::setDualRowBounds(SPxSolverBase<double> *this)

{
  Status SVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = 0;
  for (lVar3 = 0;
      lVar3 < (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set
              .thenum; lVar3 = lVar3 + 1) {
    *(undefined8 *)
     ((long)(this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + lVar2) = 0;
    *(undefined8 *)
     ((long)(this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + lVar2) = 0;
    SVar1 = SPxBasisBase<double>::dualRowStatus(&this->super_SPxBasisBase<double>,(int)lVar3);
    clearDualBounds(this,SVar1,
                    (double *)
                    ((long)(this->theURbound).val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar2),
                    (double *)
                    ((long)(this->theLRbound).val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar2));
    lVar2 = lVar2 + 8;
  }
  lVar2 = 0;
  for (lVar3 = 0;
      lVar3 < (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set
              .thenum; lVar3 = lVar3 + 1) {
    *(undefined8 *)
     ((long)(this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + lVar2) = 0;
    *(undefined8 *)
     ((long)(this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + lVar2) = 0;
    SVar1 = SPxBasisBase<double>::dualColStatus(&this->super_SPxBasisBase<double>,(int)lVar3);
    clearDualBounds(this,SVar1,
                    (double *)
                    ((long)(this->theUCbound).val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar2),
                    (double *)
                    ((long)(this->theLCbound).val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar2));
    lVar2 = lVar2 + 8;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::setDualRowBounds()
{

   assert(rep() == ROW);

   int i;

   for(i = 0; i < this->nRows(); ++i)
   {
      theURbound[i] = 0.0;
      theLRbound[i] = 0.0;

      clearDualBounds(this->dualRowStatus(i), theURbound[i], theLRbound[i]);
   }

   for(i = 0; i < this->nCols(); ++i)
   {
      theUCbound[i] = 0.0;
      theLCbound[i] = 0.0;

      clearDualBounds(this->dualColStatus(i), theUCbound[i], theLCbound[i]);
   }
}